

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined4 *puVar4;
  bool bVar5;
  connectdata *conn_00;
  _Bool _Var6;
  byte bVar7;
  CURLcode CVar8;
  int iVar9;
  curl_off_t cVar10;
  char *pcVar11;
  size_t sVar12;
  CURLcode unaff_EBP;
  byte connected;
  _Bool *p_Var13;
  Curl_easy *data;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *value;
  char *name;
  char *local_60;
  void *local_58;
  char *local_50;
  size_t local_48;
  _Bool *local_40;
  connectdata *local_38;
  
  *done = false;
  pCVar2 = conn->data;
  local_58 = (pCVar2->req).protop;
  pcVar17 = (pCVar2->state).path;
  lVar14 = 1;
  pcVar16 = pcVar17 + -1;
  local_40 = done;
  local_38 = conn;
  do {
    pcVar15 = pcVar16;
    pcVar16 = pcVar15 + 1;
    _Var6 = imap_is_bchar(pcVar15[1]);
    lVar14 = lVar14 + -1;
  } while (_Var6);
  if (lVar14 == 0) {
    *(undefined8 *)((long)local_58 + 8) = 0;
LAB_001320e2:
    while (*pcVar16 == ';') {
      pcVar17 = pcVar16 + 1;
      sVar12 = 0;
      pcVar16 = pcVar17;
LAB_001320fa:
      if (*pcVar16 == '\0') goto LAB_00132248;
      if (*pcVar16 != '=') goto code_r0x0013210b;
      CVar8 = Curl_urldecode(pCVar2,pcVar17,sVar12,&local_50,(size_t *)0x0,true);
      if (CVar8 != CURLE_OK) goto LAB_00132190;
      pcVar17 = pcVar16 + 1;
      sVar12 = 0xffffffffffffffff;
      do {
        pcVar15 = pcVar16 + 1;
        pcVar16 = pcVar16 + 1;
        _Var6 = imap_is_bchar(*pcVar15);
        sVar12 = sVar12 + 1;
      } while (_Var6);
      CVar8 = Curl_urldecode(pCVar2,pcVar17,sVar12,&local_60,&local_48,true);
      if (CVar8 == CURLE_OK) {
        iVar9 = Curl_strcasecompare(local_50,"UIDVALIDITY");
        if ((iVar9 == 0) || (*(long *)((long)local_58 + 0x10) != 0)) {
          iVar9 = Curl_strcasecompare(local_50,"UID");
          if ((iVar9 == 0) || (*(long *)((long)local_58 + 0x18) != 0)) {
            iVar9 = Curl_strcasecompare(local_50,"SECTION");
            if ((iVar9 == 0) || (*(long *)((long)local_58 + 0x20) != 0)) {
              iVar9 = Curl_strcasecompare(local_50,"PARTIAL");
              if ((iVar9 == 0) || (*(long *)((long)local_58 + 0x28) != 0)) {
                (*Curl_cfree)(local_50);
                (*Curl_cfree)(local_60);
LAB_00132248:
                unaff_EBP = CURLE_URL_MALFORMAT;
                bVar5 = false;
                goto LAB_00132250;
              }
              if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
                local_60[local_48 - 1] = '\0';
              }
              *(char **)((long)local_58 + 0x28) = local_60;
            }
            else {
              if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
                local_60[local_48 - 1] = '\0';
              }
              *(char **)((long)local_58 + 0x20) = local_60;
            }
          }
          else {
            if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
              local_60[local_48 - 1] = '\0';
            }
            *(char **)((long)local_58 + 0x18) = local_60;
          }
        }
        else {
          if ((local_48 != 0) && (local_60[local_48 - 1] == '/')) {
            local_60[local_48 - 1] = '\0';
          }
          *(char **)((long)local_58 + 0x10) = local_60;
        }
        local_60 = (char *)0x0;
        (*Curl_cfree)(local_50);
        (*Curl_cfree)(local_60);
        bVar5 = true;
      }
      else {
        (*Curl_cfree)(local_50);
LAB_00132190:
        bVar5 = false;
        unaff_EBP = CVar8;
      }
LAB_00132250:
      if (!bVar5) goto LAB_001323b5;
    }
    if (((*(long *)((long)local_58 + 8) != 0) && (*pcVar16 == '?')) &&
       (*(long *)((long)local_58 + 0x18) == 0)) {
      pcVar17 = pcVar16 + 1;
      sVar12 = 0xffffffffffffffff;
      do {
        pcVar15 = pcVar16 + 1;
        pcVar16 = pcVar16 + 1;
        _Var6 = imap_is_bchar(*pcVar15);
        sVar12 = sVar12 + 1;
      } while (_Var6);
      unaff_EBP = Curl_urldecode(pCVar2,pcVar17,sVar12,(char **)((long)local_58 + 0x30),
                                 (size_t *)0x0,true);
      if (unaff_EBP != CURLE_OK) goto LAB_001323b5;
    }
    unaff_EBP = (uint)(*pcVar16 != '\0') * 3;
  }
  else {
    pcVar11 = pcVar16;
    if ((pcVar17 < pcVar16) && (pcVar11 = pcVar15, *pcVar15 != '/')) {
      pcVar11 = pcVar16;
    }
    unaff_EBP = Curl_urldecode(pCVar2,pcVar17,(long)pcVar11 - (long)pcVar17,
                               (char **)((long)local_58 + 8),(size_t *)0x0,true);
    if (unaff_EBP == CURLE_OK) {
      unaff_EBP = CURLE_OK;
      goto LAB_001320e2;
    }
  }
LAB_001323b5:
  conn_00 = local_38;
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pCVar2 = local_38->data;
  pcVar17 = (pCVar2->set).str[6];
  if (pcVar17 == (char *)0x0) {
LAB_00132414:
    CVar8 = CURLE_OK;
  }
  else {
    pvVar3 = (pCVar2->req).protop;
    CVar8 = Curl_urldecode(pCVar2,pcVar17,0,(char **)((long)pvVar3 + 0x38),(size_t *)0x0,true);
    if (CVar8 == CURLE_OK) {
      pcVar17 = *(char **)((long)pvVar3 + 0x38);
      for (pcVar16 = pcVar17; *pcVar16 != '\0'; pcVar16 = pcVar16 + 1) {
        if (*pcVar16 == ' ') {
          pcVar16 = (*Curl_cstrdup)(pcVar16);
          *(char **)((long)pvVar3 + 0x40) = pcVar16;
          *pcVar17 = '\0';
          CVar8 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)pvVar3 + 0x40) != 0) {
            CVar8 = CURLE_OK;
          }
          goto LAB_00132416;
        }
        pcVar17 = pcVar17 + 1;
      }
      goto LAB_00132414;
    }
  }
LAB_00132416:
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  pCVar2 = conn_00->data;
  (pCVar2->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar2,0);
  Curl_pgrsSetDownloadCounter(pCVar2,0);
  Curl_pgrsSetUploadSize(pCVar2,-1);
  pcVar17 = (char *)0xffffffffffffffff;
  Curl_pgrsSetDownloadSize(pCVar2,-1);
  pCVar2 = conn_00->data;
  puVar4 = (undefined4 *)(pCVar2->req).protop;
  if ((pCVar2->set).opt_no_body == true) {
    *puVar4 = 1;
  }
  *local_40 = false;
  if ((((*(char **)(puVar4 + 2) == (char *)0x0) ||
       (pcVar17 = (conn_00->proto).imapc.mailbox, pcVar17 == (char *)0x0)) ||
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 2),pcVar17), iVar9 == 0)) ||
     (((*(char **)(puVar4 + 4) != (char *)0x0 &&
       (pcVar17 = (conn_00->proto).imapc.mailbox_uidvalidity, pcVar17 != (char *)0x0)) &&
      (iVar9 = Curl_strcasecompare(*(char **)(puVar4 + 4),pcVar17), iVar9 == 0)))) {
    connected = (byte)pcVar17;
    bVar7 = 0;
  }
  else {
    connected = (byte)pcVar17;
    bVar7 = 1;
  }
  data = conn_00->data;
  if (((data->set).upload == false) && ((pCVar2->set).mimepost.kind == MIMEKIND_NONE)) {
    lVar14 = *(long *)(puVar4 + 0xe);
    if ((lVar14 == 0) || ((bVar7 == 0 && (*(long *)(puVar4 + 2) != 0)))) {
      connected = bVar7 ^ 1 | lVar14 != 0;
      if (connected == 0) {
        if (*(long *)(puVar4 + 6) != 0) {
          CVar8 = imap_perform_fetch(conn_00);
          goto LAB_00132756;
        }
        if (*(long *)(puVar4 + 0xc) != 0) {
          CVar8 = imap_perform_search(conn_00);
          goto LAB_00132756;
        }
      }
      if ((bVar7 == 0 && *(long *)(puVar4 + 2) != 0) &&
         (((lVar14 != 0 || (*(long *)(puVar4 + 6) != 0)) || (*(long *)(puVar4 + 0xc) != 0)))) {
        pvVar3 = (data->req).protop;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox);
        (conn_00->proto).imapc.mailbox = (char *)0x0;
        (*Curl_cfree)((conn_00->proto).imapc.mailbox_uidvalidity);
        (conn_00->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar17 = *(char **)((long)pvVar3 + 8);
        if (pcVar17 == (char *)0x0) {
          data = conn_00->data;
          pcVar17 = "Cannot SELECT without a mailbox.";
          goto LAB_00132633;
        }
        connected = 0;
        pcVar17 = imap_atom(pcVar17,false);
        if (pcVar17 != (char *)0x0) {
          connected = 0xee;
          CVar8 = imap_sendf(conn_00,"SELECT %s",pcVar17);
          (*Curl_cfree)(pcVar17);
          if (CVar8 == CURLE_OK) {
            (conn_00->proto).imapc.state = IMAP_SELECT;
          }
          goto LAB_00132756;
        }
        goto LAB_00132751;
      }
    }
    CVar8 = imap_perform_list(conn_00);
  }
  else {
    pvVar3 = (data->req).protop;
    if (*(long *)((long)pvVar3 + 8) == 0) {
      pcVar17 = "Cannot APPEND without a mailbox.";
LAB_00132633:
      Curl_failf(data,pcVar17);
      connected = (byte)pcVar17;
      CVar8 = CURLE_URL_MALFORMAT;
      goto LAB_00132756;
    }
    if ((data->set).mimepost.kind != MIMEKIND_NONE) {
      part = &(data->set).mimepost;
      puVar1 = &(data->set).mimepost.flags;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
      curl_mime_headers(part,(data->set).headers,0);
      connected = 0;
      CVar8 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if (CVar8 == CURLE_OK) {
        connected = 0x6a;
        pcVar17 = Curl_checkheaders(conn_00,"Mime-Version");
        CVar8 = CURLE_OK;
        if (pcVar17 == (char *)0x0) {
          connected = 0x77;
          CVar8 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0");
        }
      }
      if (CVar8 == CURLE_OK) {
        CVar8 = Curl_mime_rewind(part);
      }
      if (CVar8 != CURLE_OK) goto LAB_00132756;
      cVar10 = Curl_mime_size(part);
      (data->state).infilesize = cVar10;
      (data->state).fread_func = Curl_mime_read;
      (data->state).in = part;
    }
    if ((data->state).infilesize < 0) {
      connected = 0x89;
      Curl_failf(data,"Cannot APPEND with unknown input file size\n");
      CVar8 = CURLE_UPLOAD_FAILED;
      goto LAB_00132756;
    }
    connected = 0;
    pcVar17 = imap_atom(*(char **)((long)pvVar3 + 8),false);
    if (pcVar17 != (char *)0x0) {
      connected = 0xb5;
      CVar8 = imap_sendf(conn_00,"APPEND %s (\\Seen) {%ld}",pcVar17,(data->state).infilesize);
      (*Curl_cfree)(pcVar17);
      if (CVar8 == CURLE_OK) {
        (conn_00->proto).imapc.state = IMAP_APPEND;
      }
      goto LAB_00132756;
    }
LAB_00132751:
    CVar8 = CURLE_OUT_OF_MEMORY;
  }
LAB_00132756:
  if (CVar8 == CURLE_OK) {
    p_Var13 = local_40;
    CVar8 = imap_multi_statemach(conn_00,local_40);
    connected = (byte)p_Var13;
  }
  if ((CVar8 == CURLE_OK) && (CVar8 = CURLE_OK, *local_40 == true)) {
    imap_dophase_done(conn_00,(_Bool)connected);
  }
  return CVar8;
code_r0x0013210b:
  pcVar16 = pcVar16 + 1;
  sVar12 = sVar12 + 1;
  goto LAB_001320fa;
}

Assistant:

static CURLcode imap_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(conn);
  if(result)
    return result;

  result = imap_regular_transfer(conn, done);

  return result;
}